

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * valueAsString<std::__cxx11::string>(string *__return_storage_ptr__,string *value)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<std::string>(std::string value)
{
  return value;
}